

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O2

Option<const_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>_&>
 __thiscall
Lib::
Map<const_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
::tryGet(Map<const_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
         *this,Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> **key)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *pPVar4;
  Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> **in_RDX;
  Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *pPVar5;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> **ppMVar6;
  
  uVar3 = hashCode((Map<const_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
                    *)key,in_RDX);
  pPVar4 = key[1];
  ppMVar6 = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> **)0x0;
  pPVar5 = pPVar4 + (ulong)uVar3 % (ulong)*(uint *)key;
  do {
    uVar1 = (uint)(pPVar5->_summands)._capacity;
    if (uVar1 == 0) {
LAB_0029101d:
      *(Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> ***)this = ppMVar6;
      return (OptionBase<const_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>_&>
              )(OptionBase<const_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>_&>
                )this;
    }
    if (uVar1 == uVar3) {
      bVar2 = Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::operator==
                        ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)
                         (pPVar5->_summands)._stack,&(*in_RDX)->_summands);
      if (bVar2) {
        ppMVar6 = &(pPVar5->_summands)._cursor;
        goto LAB_0029101d;
      }
      pPVar4 = key[1];
    }
    pPVar5 = pPVar5 + 1;
    if (pPVar5 == key[2]) {
      pPVar5 = pPVar4;
    }
  } while( true );
}

Assistant:

Option<Val const&> tryGet(Key const& key) const
  {
    using Opt = Option<Val const&>;

    auto code = hashCode(key);
    Entry* entry;
    for (entry = firstEntryForCode(code); entry->occupied(); entry = nextEntry(entry)) {
      if (entry->code == code && Hash::equals(entry->key(),key)) {
        return Opt(entry->value());
      }
    }

    return Opt();
  }